

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FuncDefInsert(FuncDefHash *pHash,FuncDef *pDef)

{
  byte bVar1;
  byte *zFunc;
  uint uVar2;
  byte *pbVar3;
  FuncDef *pFVar4;
  FuncDef **ppFVar5;
  uint uVar6;
  long lVar7;
  
  zFunc = (byte *)pDef->zName;
  if (zFunc == (byte *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    pbVar3 = zFunc;
    do {
      uVar6 = uVar6 + 1;
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    uVar6 = uVar6 & 0x3fffffff;
  }
  uVar2 = ""[*zFunc] + uVar6;
  uVar2 = uVar2 / 0x17 + (uVar2 / 0x17) * -0x18 + uVar2;
  pFVar4 = functionSearch(pHash,uVar2,(char *)zFunc,uVar6);
  if (pFVar4 == (FuncDef *)0x0) {
    pDef->pNext = (FuncDef *)0x0;
    ppFVar5 = pHash->a + uVar2;
    lVar7 = 0x38;
  }
  else {
    ppFVar5 = &pFVar4->pNext;
    lVar7 = 0x10;
  }
  *(FuncDef **)((long)&pDef->nArg + lVar7) = *ppFVar5;
  *ppFVar5 = pDef;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FuncDefInsert(
  FuncDefHash *pHash,  /* The hash table into which to insert */
  FuncDef *pDef        /* The function definition to insert */
){
  FuncDef *pOther;
  int nName = sqlite3Strlen30(pDef->zName);
  u8 c1 = (u8)pDef->zName[0];
  int h = (sqlite3UpperToLower[c1] + nName) % ArraySize(pHash->a);
  pOther = functionSearch(pHash, h, pDef->zName, nName);
  if( pOther ){
    assert( pOther!=pDef && pOther->pNext!=pDef );
    pDef->pNext = pOther->pNext;
    pOther->pNext = pDef;
  }else{
    pDef->pNext = 0;
    pDef->pHash = pHash->a[h];
    pHash->a[h] = pDef;
  }
}